

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_xz.c
# Opt level: O3

void test_option_xz(void)

{
  wchar_t wVar1;
  char *__haystack;
  char *pcVar2;
  size_t s;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                      ,L'\x11',"f",L'Ƥ',L'\xffffffff',"a");
  wVar1 = systemf("%s -cf - --xz f >archive.out 2>archive.err",testprog);
  __haystack = slurpfile(&s,"archive.err");
  __haystack[s] = '\0';
  if (wVar1 == L'\0') {
    free(__haystack);
    __haystack = slurpfile(&s,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                     ,L'%',(uint)(2 < s),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                        ,L'&',__haystack,"p",anon_var_dwarf_1ebf4,
                        "\"\\xFD\\x37\\x7A\\x58\\x5A\\x00\"",6,"6",(void *)0x0);
  }
  else {
    pcVar2 = strstr(__haystack,"Unsupported compression");
    if (pcVar2 == (char *)0x0) {
      failure("--xz option is broken");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                          ,L'\x1f',(long)wVar1,"r",0,"0",(void *)0x0);
    }
    else {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_xz.c"
                     ,L'\x1a');
      test_skipping("This version of bsdtar was compiled without xz support");
    }
  }
  free(__haystack);
  return;
}

Assistant:

DEFINE_TEST(test_option_xz)
{
	char *p;
	int r;
	size_t s;

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with xz compression. */
	r = systemf("%s -cf - --xz f >archive.out 2>archive.err",
	    testprog);
	p = slurpfile(&s, "archive.err");
	p[s] = '\0';
	if (r != 0) {
		if (strstr(p, "Unsupported compression") != NULL) {
			skipping("This version of bsdtar was compiled "
			    "without xz support");
			goto done;
		}
		failure("--xz option is broken");
		assertEqualInt(r, 0);
		goto done;
	}
	free(p);
	/* Check that the archive file has an xz signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "\xFD\x37\x7A\x58\x5A\x00", 6);
done:
	free(p);
}